

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

void __thiscall n_e_s::core::Pipeline::execute_step(Pipeline *this)

{
  function<n_e_s::core::StepResult_()> *this_00;
  StepResult SVar1;
  
  do {
    this_00 = (this->steps_).
              super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->steps_).
        super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == this_00) {
      return;
    }
    SVar1 = std::function<n_e_s::core::StepResult_()>::operator()(this_00);
    std::
    deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
    ::pop_front(&this->steps_);
    this->continue_ = SVar1 != Stop;
  } while (SVar1 == Skip);
  return;
}

Assistant:

void Pipeline::execute_step() {
    if (!steps_.empty()) {
        const StepResult res = steps_.front()();
        steps_.pop_front();

        continue_ = res != StepResult::Stop;

        if (res == StepResult::Skip) {
            execute_step();
        }
    }
}